

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id *pIVar3;
  Id IVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Vector<spv::Id> members;
  Id local_30;
  Id local_2c;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_28;
  
  ppIVar1 = this->groupedTypes[0x1e].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)this->groupedTypes[0x1e].
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3;
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  while( true ) {
    if (uVar6 == uVar7) {
      local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_30 = type1;
      local_2c = type0;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_28,
                 &local_2c);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_28,
                 &local_30);
      IVar4 = makeStructType(this,(Vector<Id> *)&local_28,"ResType");
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                (&local_28);
      return IVar4;
    }
    pIVar2 = ppIVar1[uVar7];
    pIVar3 = (pIVar2->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((((long)*(pointer *)
                  ((long)&(pIVar2->operands).
                          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                          ._M_impl + 8) - (long)pIVar3 & 0x3fffffffcU) == 8) && (*pIVar3 == type0))
       && (pIVar3[1] == type1)) break;
    uVar7 = uVar7 + 1;
  }
  return pIVar2->resultId;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    dxil_spv::Vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}